

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer.cpp
# Opt level: O1

bool __thiscall
Fossilize::ExternalReplayer::get_faulty_spirv_modules
          (ExternalReplayer *this,size_t *num_hashes,Hash *hashes)

{
  Impl *pIVar1;
  _Hash_node_base *p_Var2;
  
  pIVar1 = this->impl;
  if (hashes == (Hash *)0x0) {
    *num_hashes = (pIVar1->faulty_spirv_modules)._M_h._M_element_count;
  }
  else {
    if (*num_hashes != (pIVar1->faulty_spirv_modules)._M_h._M_element_count) {
      return false;
    }
    for (p_Var2 = (pIVar1->faulty_spirv_modules)._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      *hashes = (Hash)p_Var2[1]._M_nxt;
      hashes = hashes + 1;
    }
  }
  return true;
}

Assistant:

bool ExternalReplayer::get_faulty_spirv_modules(size_t *num_hashes, Hash *hashes) const
{
	return impl->get_faulty_spirv_modules(num_hashes, hashes);
}